

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O3

_Bool qp_isinvalid(priority_queue *qp)

{
  wchar_t wVar1;
  _Bool _Var2;
  ulong uVar3;
  wchar_t *pwVar4;
  
  if ((qp == (priority_queue *)0x0) || (uVar3 = qp->count, qp->size < uVar3)) {
LAB_001f8cd6:
    _Var2 = true;
  }
  else {
    if (uVar3 < 2) {
      return false;
    }
    if ((uVar3 & 1) == 0) {
      if (qp->data[uVar3 - 1].priority < *(wchar_t *)((long)qp->data + uVar3 * 8 + -8))
      goto LAB_001f8cd6;
      uVar3 = uVar3 - 2;
    }
    else {
      uVar3 = uVar3 - 1;
    }
    if (uVar3 < 2) {
      return false;
    }
    pwVar4 = &qp->data[uVar3].priority;
    do {
      wVar1 = *(wchar_t *)((long)&qp->data->priority + (uVar3 * 8 - 8 & 0xfffffffffffffff0));
      if ((*pwVar4 < wVar1) || (pwVar4[-4] < wVar1)) goto LAB_001f8cd6;
      uVar3 = uVar3 - 2;
      pwVar4 = pwVar4 + -8;
      _Var2 = false;
    } while (1 < uVar3);
  }
  return _Var2;
}

Assistant:

bool qp_isinvalid(const struct priority_queue *qp)
{
	size_t start, parent;

	if (!qp || qp->count > qp->size) {
		return true;
	}

	/* Queues with less than two elements have nothing to check. */
	if (qp->count < 2) {
		return false;
	}

	if ((qp->count & 1) == 0) {
		/*
		 * On the deepest layer, there is a node that does not have
		 * a sibling with the same parent.
		 */
		parent = (qp->count - 2) >> 1;
		if (qp->data[qp->count - 1].priority
				< qp->data[parent].priority) {
			return true;
		}
		start = qp->count - 2;
	} else {
		/* All nodes on the deepest layer have a sibling. */
		start = qp->count - 1;
	}

	while (start > 1) {
		parent = (start - 1) >> 1;
		if (qp->data[start].priority < qp->data[parent].priority
				|| qp->data[start - 1].priority
				< qp->data[parent].priority) {
			return true;
		}
		start -= 2;
	}
	return false;
}